

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_export.cpp
# Opt level: O2

string * duckdb::SanitizeExportIdentifier(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  char cVar2;
  int val;
  idx_t i;
  ulong uVar3;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  for (uVar3 = 0; uVar3 < str->_M_string_length; uVar3 = uVar3 + 1) {
    cVar1 = (str->_M_dataplus)._M_p[uVar3];
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar2 = '_';
      if ((byte)(cVar1 + 0xbfU) < 0x1a) {
        val = tolower((int)cVar1);
        cVar2 = NumericCastImpl<char,_int,_false>::Convert(val);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar3] = cVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string SanitizeExportIdentifier(const string &str) {
	// Copy the original string to result
	string result(str);

	for (idx_t i = 0; i < str.length(); ++i) {
		auto c = str[i];
		if (c >= 'a' && c <= 'z') {
			// If it is lower case just continue
			continue;
		}

		if (c >= 'A' && c <= 'Z') {
			// To lowercase
			result[i] = NumericCast<char>(tolower(c));
		} else {
			// Substitute to underscore
			result[i] = '_';
		}
	}

	return result;
}